

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

int32_t __thiscall
charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>
::decode_run_interruption_error
          (jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>
           *this,context_run_mode *context)

{
  int iVar1;
  int32_t iVar2;
  int32_t e_mapped_error_value_00;
  int32_t iVar3;
  const_reference pvVar4;
  int32_t error_value;
  int32_t e_mapped_error_value;
  int32_t k;
  context_run_mode *context_local;
  jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::decoder_strategy>
  *this_local;
  
  iVar2 = context_run_mode::get_golomb_code(context);
  iVar1 = (this->traits_).limit;
  pvVar4 = std::array<int,_32UL>::operator[]((array<int,_32UL> *)J,(long)this->run_index_);
  e_mapped_error_value_00 =
       decode_value(this,iVar2,(iVar1 - *pvVar4) + -1,(this->traits_).quantized_bits_per_pixel);
  iVar3 = context_run_mode::run_interruption_type(context);
  iVar2 = context_run_mode::compute_error_value(context,e_mapped_error_value_00 + iVar3,iVar2);
  context_run_mode::update_variables(context,iVar2,e_mapped_error_value_00,this->reset_threshold_);
  return iVar2;
}

Assistant:

int32_t decode_run_interruption_error(context_run_mode& context)
    {
        const int32_t k{context.get_golomb_code()};
        const int32_t e_mapped_error_value{
            decode_value(k, traits_.limit - J[run_index_] - 1, traits_.quantized_bits_per_pixel)};
        const int32_t error_value{context.compute_error_value(e_mapped_error_value + context.run_interruption_type(), k)};
        context.update_variables(error_value, e_mapped_error_value, reset_threshold_);
        return error_value;
    }